

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O3

void * I_FindFirst(char *filespec,findstate_t *fileinfo)

{
  int iVar1;
  char *pcVar2;
  findstate_t *pfVar3;
  FString dir;
  FString local_20;
  FString local_18;
  
  local_20.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  pcVar2 = strrchr(filespec,0x2f);
  if (pcVar2 == (char *)0x0) {
    pattern = filespec;
    FString::operator=(&local_20,".");
  }
  else {
    pattern = pcVar2 + 1;
    FString::FString(&local_18,filespec,(size_t)(pcVar2 + (1 - (long)filespec)));
    FString::operator=(&local_20,&local_18);
    FString::~FString(&local_18);
  }
  fileinfo->current = 0;
  iVar1 = scandir(local_20.Chars,(dirent ***)&fileinfo->namelist,matchfile,alphasort);
  fileinfo->count = iVar1;
  pfVar3 = (findstate_t *)0xffffffffffffffff;
  if (0 < iVar1) {
    pfVar3 = fileinfo;
  }
  FString::~FString(&local_20);
  return pfVar3;
}

Assistant:

void *I_FindFirst (const char *filespec, findstate_t *fileinfo)
{
	FString dir;
	
	const char *slash = strrchr (filespec, '/');
	if (slash)
	{
		pattern = slash+1;
		dir = FString(filespec, slash-filespec+1);
	}
	else
	{
		pattern = filespec;
		dir = ".";
	}

    fileinfo->current = 0;
    fileinfo->count = scandir (dir.GetChars(), &fileinfo->namelist,
							   matchfile, alphasort);
    if (fileinfo->count > 0)
    {
		return fileinfo;
    }
    return (void*)-1;
}